

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int quicly_get_stats(quicly_conn_t *conn,quicly_stats_t *stats)

{
  quicly_cc_type_t *pqVar1;
  uint64_t uVar2;
  double dVar3;
  undefined8 uVar4;
  int64_t iVar5;
  int64_t iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  undefined4 uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  
  memcpy(stats,&(conn->super).stats,0x1d0);
  uVar7 = (conn->egress).loss.rtt.smoothed;
  uVar8 = (conn->egress).loss.rtt.variance;
  uVar9 = (conn->egress).loss.rtt.latest;
  (stats->rtt).minimum = (conn->egress).loss.rtt.minimum;
  (stats->rtt).smoothed = uVar7;
  (stats->rtt).variance = uVar8;
  (stats->rtt).latest = uVar9;
  pqVar1 = (conn->egress).cc.type;
  uVar15 = (conn->egress).cc.cwnd;
  uVar16 = (conn->egress).cc.ssthresh;
  uVar2 = (conn->egress).cc.recovery_end;
  dVar3 = (conn->egress).cc.state.cubic.k;
  uVar4 = *(undefined8 *)((long)&(conn->egress).cc.state + 8);
  iVar5 = (conn->egress).cc.state.cubic.avoidance_start;
  iVar6 = (conn->egress).cc.state.cubic.last_sent_time;
  uVar13 = (conn->egress).cc.cwnd_initial;
  uVar14 = (conn->egress).cc.cwnd_exiting_slow_start;
  uVar7 = (conn->egress).cc.cwnd_initial;
  uVar8 = (conn->egress).cc.cwnd_exiting_slow_start;
  uVar9 = (conn->egress).cc.cwnd_minimum;
  uVar10 = (conn->egress).cc.cwnd_maximum;
  uVar11 = (conn->egress).cc.num_loss_episodes;
  uVar12 = *(undefined4 *)&(conn->egress).cc.field_0x4c;
  (stats->cc).state.cubic.last_sent_time = (conn->egress).cc.state.cubic.last_sent_time;
  (stats->cc).cwnd_initial = uVar7;
  (stats->cc).cwnd_exiting_slow_start = uVar8;
  (stats->cc).cwnd_minimum = uVar9;
  (stats->cc).cwnd_maximum = uVar10;
  (stats->cc).num_loss_episodes = uVar11;
  *(undefined4 *)&(stats->cc).field_0x4c = uVar12;
  *(undefined8 *)((long)&(stats->cc).state + 8) = uVar4;
  (stats->cc).state.cubic.avoidance_start = iVar5;
  (stats->cc).state.cubic.last_sent_time = iVar6;
  (stats->cc).cwnd_initial = uVar13;
  (stats->cc).cwnd_exiting_slow_start = uVar14;
  (stats->cc).type = pqVar1;
  (stats->cc).cwnd = uVar15;
  (stats->cc).ssthresh = uVar16;
  (stats->cc).recovery_end = uVar2;
  (stats->cc).state.cubic.k = dVar3;
  return 0;
}

Assistant:

int quicly_get_stats(quicly_conn_t *conn, quicly_stats_t *stats)
{
    /* copy the pre-built stats fields */
    memcpy(stats, &conn->super.stats, sizeof(conn->super.stats));

    /* set or generate the non-pre-built stats fields here */
    stats->rtt = conn->egress.loss.rtt;
    stats->cc = conn->egress.cc;
    return 0;
}